

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe.c
# Opt level: O1

void av1_init_tile_data(AV1_COMP *cpi)

{
  byte bVar1;
  TileInfo *tile;
  char cVar2;
  MODE MVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  INTERNAL_COST_UPDATE_TYPE IVar7;
  TileDataEnc *pTVar8;
  INTERNAL_COST_UPDATE_TYPE *pIVar9;
  byte bVar10;
  TokenExtra *pTVar11;
  TokenList *pTVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  bool bVar18;
  int local_94;
  ulong local_88;
  TokenList *(*local_70) [64];
  TokenList *local_68;
  TokenExtra *local_60;
  
  bVar18 = ((cpi->common).seq_params)->monochrome == '\0';
  uVar13 = bVar18 + 1 + (uint)bVar18;
  uVar4 = (cpi->common).tiles.cols;
  uVar5 = (cpi->common).tiles.rows;
  local_60 = (cpi->token_info).tile_tok[0][0];
  local_68 = (cpi->token_info).tplist[0][0];
  if ((((cpi->oxcf).pass != AOM_RC_FIRST_PASS) && (cpi->compressor_stage != '\x01')) &&
     ((cpi->common).features.allow_screen_content_tools == true)) {
    uVar15 = 2;
    if (uVar13 < 2) {
      uVar15 = uVar13;
    }
    uVar15 = ((cpi->common).mi_params.mb_cols + 7U >> 3) *
             ((cpi->common).mi_params.mb_rows + 7U >> 3) * uVar15 * 0x4000;
    if ((cpi->token_info).tokens_allocated < uVar15) {
      aom_free((cpi->token_info).tile_tok[0][0]);
      (cpi->token_info).tile_tok[0][0] = (TokenExtra *)0x0;
      aom_free((cpi->token_info).tplist[0][0]);
      (cpi->token_info).tplist[0][0] = (TokenList *)0x0;
      (cpi->token_info).tokens_allocated = 0;
      iVar6 = (cpi->common).mi_params.mi_rows;
      bVar1 = (byte)((cpi->common).seq_params)->mib_size_log2;
      (cpi->token_info).tokens_allocated = uVar15;
      pTVar11 = (TokenExtra *)aom_calloc((ulong)uVar15,1);
      (cpi->token_info).tile_tok[0][0] = pTVar11;
      if (pTVar11 == (TokenExtra *)0x0) {
        aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate token_info->tile_tok[0][0]");
      }
      pTVar12 = (TokenList *)
                aom_calloc((long)((iVar6 + (1 << (bVar1 & 0x1f)) + -1 >> (bVar1 & 0x1f)) << 0xc),
                           0x10);
      (cpi->token_info).tplist[0][0] = pTVar12;
      if (pTVar12 == (TokenList *)0x0) {
        aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate token_info->tplist[0][0]");
      }
      local_60 = (cpi->token_info).tile_tok[0][0];
      local_68 = (cpi->token_info).tplist[0][0];
    }
  }
  if (0 < (int)uVar5) {
    uVar15 = 2;
    if (uVar13 < 2) {
      uVar15 = uVar13;
    }
    local_70 = (cpi->token_info).tplist;
    lVar17 = 0;
    local_88 = 0;
    local_94 = 0;
    uVar13 = 0;
    do {
      if (0 < (int)uVar4) {
        uVar14 = 0;
        lVar16 = lVar17;
        do {
          pTVar8 = cpi->tile_data;
          tile = (TileInfo *)((long)((pTVar8->tctx).txb_skip_cdf + -1) + 0x2e + lVar16);
          av1_tile_init(tile,&cpi->common,(int)local_88,(int)uVar14);
          *(undefined4 *)((long)&(pTVar8->firstpass_top_mv).row + lVar16) = 0;
          *(undefined8 *)((long)pTVar8->inter_mode_rd_models + lVar16 + -0x10) = 0;
          if (((cpi->token_info).tile_tok[0][0] != (TokenExtra *)0x0) &&
             ((cpi->token_info).tplist[0][0] != (TokenList *)0x0)) {
            local_60 = local_60 + uVar13;
            (*(TokenExtra *(*) [64])(local_70 + -0x40))[uVar14] = local_60;
            cVar2 = (char)((cpi->common).seq_params)->mib_size_log2;
            bVar1 = cVar2 + 2;
            bVar10 = cVar2 - 2;
            uVar13 = ~(-1 << (bVar10 & 0x1f));
            uVar13 = ((int)(uVar13 + ((*(int *)((long)((pTVar8->tctx).txb_skip_cdf + -1) + 0x3a +
                                               lVar16) -
                                      *(int *)((long)((pTVar8->tctx).txb_skip_cdf + -1) + 0x36 +
                                              lVar16)) + 2 >> 2)) >> (bVar10 & 0x1f)) *
                     ((int)(((*(int *)((long)((pTVar8->tctx).txb_skip_cdf + -1) + 0x32 + lVar16) -
                             *(int *)((long)((pTVar8->tctx).txb_skip_cdf + -1) + 0x2e + lVar16)) + 2
                            >> 2) + uVar13) >> (bVar10 & 0x1f)) *
                     ((1 << (bVar1 & 0x1f)) << (bVar1 & 0x1f)) * uVar15;
            local_68 = local_68 + local_94;
            (*local_70)[uVar14] = local_68;
            local_94 = av1_get_sb_rows_in_tile(&cpi->common,tile);
          }
          bVar18 = (cpi->common).tiles.large_scale == 0;
          *(bool *)((long)pTVar8->inter_mode_rd_models + lVar16 + -8) = bVar18;
          if ((bVar18) && ((cpi->common).features.disable_cdf_update == false)) {
            MVar3 = (cpi->oxcf).mode;
            bVar18 = true;
            if (MVar3 == '\x01') {
              if (((cpi->sf).inter_sf.coeff_cost_upd_level < INTERNAL_COST_UPD_SBROW_SET) &&
                 ((cpi->sf).inter_sf.mode_cost_upd_level < INTERNAL_COST_UPD_SBROW_SET)) {
                IVar7 = (cpi->sf).intra_sf.dv_cost_upd_level;
                pIVar9 = &(cpi->sf).inter_sf.mv_cost_upd_level;
                goto joined_r0x001a3120;
              }
            }
            else if ((MVar3 == '\x02') &&
                    ((cpi->sf).inter_sf.coeff_cost_upd_level < INTERNAL_COST_UPD_SBROW_SET)) {
              IVar7 = (cpi->sf).inter_sf.mode_cost_upd_level;
              pIVar9 = &(cpi->sf).intra_sf.dv_cost_upd_level;
joined_r0x001a3120:
              if (IVar7 < INTERNAL_COST_UPD_SBROW_SET) {
                bVar18 = INTERNAL_COST_UPD_TILE < *pIVar9;
              }
            }
          }
          else {
            bVar18 = false;
          }
          *(bool *)((long)pTVar8->inter_mode_rd_models + lVar16 + -8) = bVar18;
          memcpy((void *)((long)(pTVar8->tctx).txb_skip_cdf[0][0] + lVar16),(cpi->common).fc,0x52fc)
          ;
          uVar14 = uVar14 + 1;
          lVar16 = lVar16 + 0x5d10;
        } while (uVar4 != uVar14);
      }
      local_88 = local_88 + 1;
      lVar17 = lVar17 + (ulong)uVar4 * 0x5d10;
      local_70 = local_70 + 1;
    } while (local_88 != uVar5);
  }
  return;
}

Assistant:

void av1_init_tile_data(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);
  const int tile_cols = cm->tiles.cols;
  const int tile_rows = cm->tiles.rows;
  int tile_col, tile_row;
  TokenInfo *const token_info = &cpi->token_info;
  TokenExtra *pre_tok = token_info->tile_tok[0][0];
  TokenList *tplist = token_info->tplist[0][0];
  unsigned int tile_tok = 0;
  int tplist_count = 0;

  if (!is_stat_generation_stage(cpi) &&
      cm->features.allow_screen_content_tools) {
    // Number of tokens for which token info needs to be allocated.
    unsigned int tokens_required =
        get_token_alloc(cm->mi_params.mb_rows, cm->mi_params.mb_cols,
                        MAX_SB_SIZE_LOG2, num_planes);
    // Allocate/reallocate memory for token related info if the number of tokens
    // required is more than the number of tokens already allocated. This could
    // occur in case of the following:
    // 1) If the memory is not yet allocated
    // 2) If the frame dimensions have changed
    const bool realloc_tokens = tokens_required > token_info->tokens_allocated;
    if (realloc_tokens) {
      free_token_info(token_info);
      alloc_token_info(cm, token_info, tokens_required);
      pre_tok = token_info->tile_tok[0][0];
      tplist = token_info->tplist[0][0];
    }
  }

  for (tile_row = 0; tile_row < tile_rows; ++tile_row) {
    for (tile_col = 0; tile_col < tile_cols; ++tile_col) {
      TileDataEnc *const tile_data =
          &cpi->tile_data[tile_row * tile_cols + tile_col];
      TileInfo *const tile_info = &tile_data->tile_info;
      av1_tile_init(tile_info, cm, tile_row, tile_col);
      tile_data->firstpass_top_mv = kZeroMv;
      tile_data->abs_sum_level = 0;

      if (is_token_info_allocated(token_info)) {
        token_info->tile_tok[tile_row][tile_col] = pre_tok + tile_tok;
        pre_tok = token_info->tile_tok[tile_row][tile_col];
        tile_tok = allocated_tokens(
            tile_info, cm->seq_params->mib_size_log2 + MI_SIZE_LOG2,
            num_planes);
        token_info->tplist[tile_row][tile_col] = tplist + tplist_count;
        tplist = token_info->tplist[tile_row][tile_col];
        tplist_count = av1_get_sb_rows_in_tile(cm, tile_info);
      }
      tile_data->allow_update_cdf = !cm->tiles.large_scale;
      tile_data->allow_update_cdf = tile_data->allow_update_cdf &&
                                    !cm->features.disable_cdf_update &&
                                    !delay_wait_for_top_right_sb(cpi);
      tile_data->tctx = *cm->fc;
    }
  }
}